

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformdatabuilder.cpp
# Opt level: O0

QHttpPart __thiscall
QFormDataPartBuilderPrivate::build(QFormDataPartBuilderPrivate *this,Options options)

{
  QAnyStringView in;
  QByteArrayView src;
  bool bVar1;
  Int IVar2;
  const_iterator pQVar3;
  qsizetype qVar4;
  add_pointer_t<QIODevice_*> ppQVar5;
  add_pointer_t<QByteArray> ptVar6;
  storage_type *in_RSI;
  QHttpPartPrivate *in_RDI;
  long in_FS_OFFSET;
  add_pointer_t<QByteArray> b;
  add_pointer_t<QIODevice_*> d;
  qsizetype i;
  const_iterator __end2;
  const_iterator __begin2;
  add_const_t<QString> *__range2;
  Encoding encoding;
  QHttpPart *httpPart;
  QMimeDatabase db;
  QByteArray enc;
  QChar c;
  QByteArray headerValue;
  undefined4 in_stack_fffffffffffffd58;
  Option in_stack_fffffffffffffd5c;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffd60;
  QByteArrayView *this_00;
  QLatin1String *in_stack_fffffffffffffd68;
  undefined5 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd75;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  QSharedDataPointer<QHttpPartPrivate> this_01;
  QByteArray *in_stack_fffffffffffffd90;
  QByteArrayView *local_260;
  const_iterator local_250;
  int local_240;
  QStringView in_stack_fffffffffffffdf0;
  QMimeType local_1b8 [48];
  undefined8 local_188 [4];
  undefined1 local_168 [24];
  QByteArray local_150;
  QFlagsStorageHelper<QFormDataBuilder::Option,_4> local_138;
  QFlagsStorageHelper<QFormDataBuilder::Option,_4> local_134 [11];
  undefined1 local_108 [24];
  QByteArray local_f0;
  QFlagsStorageHelper<QFormDataBuilder::Option,_4> local_d4;
  QFlagsStorageHelper<QFormDataBuilder::Option,_4> local_9c;
  QByteArray local_98;
  QChar local_7e;
  QChar local_7c;
  char16_t local_7a;
  QByteArray local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  this_01.d.ptr =
       (totally_ordered_wrapper<QHttpPartPrivate_*>)
       (totally_ordered_wrapper<QHttpPartPrivate_*>)in_RDI;
  QHttpPart::QHttpPart((QHttpPart *)in_stack_fffffffffffffd60.m_data);
  local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_68.d.size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x2ac8a2);
  QByteArray::operator+=
            ((QByteArray *)in_stack_fffffffffffffd60.m_data,
             (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  QStringView::QStringView<QString,_true>
            ((QStringView *)
             CONCAT17(in_stack_fffffffffffffd77,
                      CONCAT16(in_stack_fffffffffffffd76,
                               CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))),
             (QString *)in_stack_fffffffffffffd68);
  escapeNameAndAppend(in_stack_fffffffffffffd90,in_stack_fffffffffffffdf0);
  QByteArray::operator+=
            ((QByteArray *)in_stack_fffffffffffffd60.m_data,
             (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  bVar1 = QString::isNull((QString *)0x2ac907);
  if (!bVar1) {
    local_240 = 0;
    local_250 = QString::begin((QString *)0x2ac93e);
    pQVar3 = QString::end((QString *)in_stack_fffffffffffffd60.m_data);
    for (; local_250 != pQVar3; local_250 = local_250 + 1) {
      local_7a = local_250->ucs;
      QChar::QChar<char16_t,_true>(&local_7c,L'ÿ');
      bVar1 = operator>((QChar *)in_stack_fffffffffffffd60.m_data_utf16,
                        (QChar *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      if (bVar1) {
        local_240 = 2;
        break;
      }
      QChar::QChar<char16_t,_true>(&local_7e,L'\x7f');
      bVar1 = operator>((QChar *)in_stack_fffffffffffffd60.m_data_utf16,
                        (QChar *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      if (bVar1) {
        local_240 = 1;
      }
    }
    local_98.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_98.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_98.d.size = -0x5555555555555556;
    QByteArray::QByteArray((QByteArray *)0x2aca3e);
    local_9c.super_QFlagsStorage<QFormDataBuilder::Option>.i =
         (QFlagsStorage<QFormDataBuilder::Option>)
         QFlags<QFormDataBuilder::Option>::operator&
                   ((QFlags<QFormDataBuilder::Option> *)in_stack_fffffffffffffd60.m_data,
                    in_stack_fffffffffffffd5c);
    IVar2 = ::QFlags::operator_cast_to_int((QFlags *)&local_9c);
    in_stack_fffffffffffffd77 = IVar2 != 0 && local_240 != 2;
    if ((bool)in_stack_fffffffffffffd77) {
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffd60.m_data,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      QByteArray::~QByteArray((QByteArray *)0x2acabf);
    }
    else {
      QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffd60.m_data,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      QByteArray::~QByteArray((QByteArray *)0x2acaf9);
    }
    QByteArray::operator+=
              ((QByteArray *)in_stack_fffffffffffffd60.m_data,
               (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    local_d4.super_QFlagsStorage<QFormDataBuilder::Option>.i =
         (QFlagsStorage<QFormDataBuilder::Option>)
         QFlags<QFormDataBuilder::Option>::operator&
                   ((QFlags<QFormDataBuilder::Option> *)in_stack_fffffffffffffd60.m_data,
                    in_stack_fffffffffffffd5c);
    IVar2 = ::QFlags::operator_cast_to_int((QFlags *)&local_d4);
    if (IVar2 == 0) {
      QByteArrayView::QByteArrayView<QByteArray,_true>
                ((QByteArrayView *)
                 CONCAT17(in_stack_fffffffffffffd77,
                          CONCAT16(in_stack_fffffffffffffd76,
                                   CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))),
                 (QByteArray *)in_stack_fffffffffffffd68);
      src.m_data = in_RSI;
      src.m_size = (qsizetype)this_01.d.ptr;
      escapeNameAndAppend((QByteArray *)in_RDI,src);
    }
    else {
      QByteArray::QByteArray((QByteArray *)0x2acb49);
      QByteArray::QByteArray((QByteArray *)0x2acb56);
      QByteArray::toPercentEncoding(&local_f0,&local_98,(char)local_108);
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffd60.m_data,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      QByteArray::~QByteArray((QByteArray *)0x2acba3);
      QByteArray::~QByteArray((QByteArray *)0x2acbb0);
      QByteArray::~QByteArray((QByteArray *)0x2acbbd);
    }
    QByteArray::operator+=
              ((QByteArray *)in_stack_fffffffffffffd60.m_data,
               (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    in_stack_fffffffffffffd76 = false;
    if (local_240 != 0) {
      local_134[0].super_QFlagsStorage<QFormDataBuilder::Option>.i =
           (QFlagsStorage<QFormDataBuilder::Option>)
           QFlags<QFormDataBuilder::Option>::operator&
                     ((QFlags<QFormDataBuilder::Option> *)in_stack_fffffffffffffd60.m_data,
                      in_stack_fffffffffffffd5c);
      in_stack_fffffffffffffd76 =
           QFlags<QFormDataBuilder::Option>::operator!
                     ((QFlags<QFormDataBuilder::Option> *)local_134);
    }
    if ((bool)in_stack_fffffffffffffd76 != false) {
      local_138.super_QFlagsStorage<QFormDataBuilder::Option>.i =
           (QFlagsStorage<QFormDataBuilder::Option>)
           QFlags<QFormDataBuilder::Option>::operator&
                     ((QFlags<QFormDataBuilder::Option> *)in_stack_fffffffffffffd60.m_data,
                      in_stack_fffffffffffffd5c);
      IVar2 = ::QFlags::operator_cast_to_int((QFlags *)&local_138);
      in_stack_fffffffffffffd75 = IVar2 != 0 && local_240 == 1;
      if ((bool)in_stack_fffffffffffffd75) {
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffd60.m_data,
                   (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      }
      else {
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffd60.m_data,
                   (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      }
      QByteArray::QByteArray((QByteArray *)0x2accc9);
      QByteArray::QByteArray((QByteArray *)0x2accd6);
      QByteArray::toPercentEncoding(&local_150,&local_98,(char)local_168);
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffd60.m_data,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      QByteArray::~QByteArray((QByteArray *)0x2acd23);
      QByteArray::~QByteArray((QByteArray *)0x2acd30);
      QByteArray::~QByteArray((QByteArray *)0x2acd3d);
    }
    QByteArray::~QByteArray((QByteArray *)0x2acd4a);
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x2acd58);
  if (bVar1) {
    local_188[0] = 0xaaaaaaaaaaaaaaaa;
    QMimeDatabase::QMimeDatabase((QMimeDatabase *)local_188);
    in_stack_fffffffffffffd68 = (QLatin1String *)(in_RSI + 0x18);
    std::
    visit<QFormDataPartBuilderPrivate::build(QFlags<QFormDataBuilder::Option>)::__0,std::variant<QIODevice*,QByteArray>&>
              ((anon_class_16_2_e8807ff9 *)in_RDI,
               (variant<QIODevice_*,_QByteArray> *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,
                                 CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))));
    QMimeType::name();
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,
                                 CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))),
               (QString *)in_stack_fffffffffffffd68);
    in.m_size = (size_t)in_stack_fffffffffffffd68;
    in.field_0.m_data = in_stack_fffffffffffffd60.m_data;
    convertInto((QByteArray *)0x2ace03,in);
    QString::~QString((QString *)0x2ace10);
    QMimeType::~QMimeType(local_1b8);
    QMimeDatabase::~QMimeDatabase((QMimeDatabase *)local_188);
  }
  local_260 = (QByteArrayView *)0x0;
  while (this_00 = local_260,
        qVar4 = QHttpHeaders::size((QHttpHeaders *)
                                   CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)),
        (long)this_00 < qVar4) {
    QHttpHeaders::nameAt((QHttpHeaders *)this_01.d.ptr,(qsizetype)in_RDI);
    QByteArrayView::QByteArrayView<QLatin1String,_true>
              ((QByteArrayView *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,
                                 CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))),
               in_stack_fffffffffffffd68);
    QByteArrayView::toByteArray(this_00);
    QHttpHeaders::valueAt
              ((QHttpHeaders *)
               CONCAT17(in_stack_fffffffffffffd77,
                        CONCAT16(in_stack_fffffffffffffd76,
                                 CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))),
               (qsizetype)in_stack_fffffffffffffd68);
    QByteArrayView::toByteArray(this_00);
    QHttpPart::setRawHeader
              ((QHttpPart *)this_00,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
               (QByteArray *)0x2acefb);
    QByteArray::~QByteArray((QByteArray *)0x2acf08);
    QByteArray::~QByteArray((QByteArray *)0x2acf15);
    local_260 = (QByteArrayView *)((long)&local_260->m_size + 1);
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x2acf36);
  if (!bVar1) {
    QVariant::QVariant(&local_28,(QByteArray *)(in_RSI + 0x18));
    QHttpPart::setHeader((QHttpPart *)this_00,in_stack_fffffffffffffd5c,(QVariant *)0x2acf64);
    QVariant::~QVariant(&local_28);
  }
  QVariant::QVariant(&local_48,&local_68);
  QHttpPart::setHeader((QHttpPart *)this_00,in_stack_fffffffffffffd5c,(QVariant *)0x2acf9d);
  QVariant::~QVariant(&local_48);
  ppQVar5 = std::get_if<QIODevice*,QIODevice*,QByteArray>
                      ((variant<QIODevice_*,_QByteArray> *)0x2acfb8);
  if (ppQVar5 == (add_pointer_t<QIODevice_*>)0x0) {
    ptVar6 = std::get_if<QByteArray,QIODevice*,QByteArray>
                       ((variant<QIODevice_*,_QByteArray> *)0x2acfe7);
    if (ptVar6 != (add_pointer_t<QByteArray>)0x0) {
      QHttpPart::setBody((QHttpPart *)this_00,
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)
                        );
    }
  }
  else {
    QHttpPart::setBodyDevice
              ((QHttpPart *)this_00,
               (QIODevice *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  }
  QByteArray::~QByteArray((QByteArray *)0x2ad01b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QHttpPartPrivate>)(QSharedDataPointer<QHttpPartPrivate>)this_01.d.ptr;
}

Assistant:

QHttpPart QFormDataPartBuilderPrivate::build(QFormDataBuilder::Options options)
{
    QHttpPart httpPart;

    using Opt = QFormDataBuilder::Option;

    QByteArray headerValue;

    headerValue += "form-data; name=\"";
    escapeNameAndAppend(headerValue, m_name);
    headerValue += "\"";

    if (!m_originalBodyName.isNull()) {

        enum class Encoding { ASCII, Latin1, Utf8 } encoding = Encoding::ASCII;
        for (QChar c : std::as_const(m_originalBodyName)) {
            if (c > u'\xff') {
                encoding = Encoding::Utf8;
                break;
            } else if (c > u'\x7f') {
                encoding = Encoding::Latin1;
            }
        }
        QByteArray enc;
        if ((options & Opt::PreferLatin1EncodedFilename) && encoding != Encoding::Utf8)
            enc = m_originalBodyName.toLatin1();
        else
            enc = m_originalBodyName.toUtf8();

        headerValue += "; filename=\"";
        if (options & Opt::UseRfc7578PercentEncodedFilename)
            headerValue += enc.toPercentEncoding();
        else
            escapeNameAndAppend(headerValue, enc);
        headerValue += "\"";
        if (encoding != Encoding::ASCII && !(options & Opt::OmitRfc8187EncodedFilename)) {
            // For 'filename*' production see
            // https://datatracker.ietf.org/doc/html/rfc5987#section-3.2.1
            // For providing both filename and filename* parameters see
            // https://datatracker.ietf.org/doc/html/rfc6266#section-4.3 and
            // https://datatracker.ietf.org/doc/html/rfc8187#section-4.2
            if ((options & Opt::PreferLatin1EncodedFilename) && encoding == Encoding::Latin1)
                headerValue += "; filename*=ISO-8859-1''";
            else
                headerValue += "; filename*=UTF-8''";
            headerValue += enc.toPercentEncoding();
        }
    }

#if QT_CONFIG(mimetype)
    if (m_mimeType.isEmpty()) {
        // auto-detect
        QMimeDatabase db;
        convertInto(m_mimeType, std::visit([&](auto &arg) {
                return db.mimeTypeForFileNameAndData(m_originalBodyName, arg);
            }, m_body).name());
    }
#endif

    for (qsizetype i = 0; i < m_httpHeaders.size(); i++) {
        httpPart.setRawHeader(QByteArrayView(m_httpHeaders.nameAt(i)).toByteArray(),
                                             m_httpHeaders.valueAt(i).toByteArray());
    }

    if (!m_mimeType.isEmpty())
        httpPart.setHeader(QNetworkRequest::ContentTypeHeader, m_mimeType);

    httpPart.setHeader(QNetworkRequest::ContentDispositionHeader, std::move(headerValue));

    if (auto d = std::get_if<QIODevice*>(&m_body))
        httpPart.setBodyDevice(*d);
    else if (auto b = std::get_if<QByteArray>(&m_body))
        httpPart.setBody(*b);
    else
        Q_UNREACHABLE();

    return httpPart;
}